

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O2

void __thiscall
directed_flag_complex_computer::reorder_edges_t::operator()
          (reorder_edges_t *this,vertex_index_t *first_vertex,int param_2)

{
  vector<float,_std::allocator<float>_> *this_00;
  vector<float,_std::allocator<float>_> *pvVar1;
  iterator iVar2;
  directed_flag_complex_cell_t cell;
  vertex_index_t local_32;
  key_type local_30;
  
  local_30._vptr_directed_flag_complex_cell_t = (_func_int **)&PTR_vertex_00166290;
  local_30.vertices = first_vertex;
  if (this->reorder_filtration == true) {
    this_00 = this->new_filtration;
    pvVar1 = this->old_filtration;
    iVar2 = std::
            _Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)this->cell_hash,&local_30);
    std::vector<float,_std::allocator<float>_>::push_back
              (this_00,(pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start +
                       *(long *)((long)iVar2.
                                       super__Node_iterator_base<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_true>
                                       ._M_cur + 0x18));
  }
  local_32 = *local_30.vertices;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
            (this->new_edges,&local_32);
  local_32 = local_30.vertices[1];
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
            (this->new_edges,&local_32);
  return;
}

Assistant:

void operator()(vertex_index_t* first_vertex, int) {
		directed_flag_complex_cell_t cell(first_vertex);
		if (reorder_filtration) new_filtration.push_back(old_filtration[cell_hash.find(cell)->second]);
		new_edges.push_back(cell.vertex(0));
		new_edges.push_back(cell.vertex(1));
	}